

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O2

void Eigen::internal::
     Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::sub_assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
     ::run(Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>
           *dst,SrcXprType *src,sub_assign_op<float,_float> *param_3)

{
  if (((dst->
       super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
       .m_rows.m_value ==
       (src->m_lhs).m_rhs.
       super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>.
       m_rows.m_value) &&
     ((dst->
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_cols.m_value ==
      (src->m_rhs).
      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_cols.m_value)) {
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>const,-1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,-1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::subTo<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>>
              (dst,&src->m_lhs,&src->m_rhs);
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/ProductEvaluators.h"
                ,0xb0,
                "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>, Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<const Eigen::Matrix<float, -1, 8>, -1, 1>>, Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 1>>>, Eigen::internal::sub_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<const Eigen::Matrix<float, -1, 8>, -1, 1>>, Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 1>>>, Functor = Eigen::internal::sub_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
               );
}

Assistant:

T value() const { return m_value; }